

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddIsop.c
# Opt level: O0

DdNode * Cudd_bddIsop(DdManager *dd,DdNode *L,DdNode *U)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *U_local;
  DdNode *L_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddBddIsop(dd,L,U);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode  *
Cudd_bddIsop(
  DdManager * dd,
  DdNode * L,
  DdNode * U)
{
    DdNode      *res;

    do {
        dd->reordered = 0;
        res = cuddBddIsop(dd, L, U);
    } while (dd->reordered == 1);
    return(res);

}